

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

int PAL_atexit(_func_void *function)

{
  int iVar1;
  int ret;
  _func_void *function_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  iVar1 = atexit((__func *)function);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return iVar1;
}

Assistant:

int
PAL_atexit(void (__cdecl *function)(void))
{
    int ret;
    
    PERF_ENTRY(atexit);
    ENTRY ("atexit(function=%p)\n", function);
    ret = atexit(function);
    LOGEXIT ("atexit returns int %d", ret);
    PERF_EXIT(atexit);
    return ret;
}